

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_edge.c
# Opt level: O0

REF_STATUS ref_edge_uniq(REF_EDGE ref_edge,REF_INT node0,REF_INT node1)

{
  int iVar1;
  uint uVar2;
  REF_INT *pRVar3;
  int local_3c;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT chunk;
  REF_INT orig;
  REF_STATUS ref_private_macro_code_rxs;
  REF_INT edge;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_EDGE ref_edge_local;
  
  ref_private_macro_code_rxs = node1;
  edge = node0;
  _node1_local = ref_edge;
  uVar2 = ref_edge_with(ref_edge,node0,node1,&orig);
  if ((uVar2 == 0) || (uVar2 == 5)) {
    if (orig == -1) {
      if (_node1_local->max <= _node1_local->n) {
        iVar1 = _node1_local->max;
        if ((int)((double)iVar1 * 1.5) < 5000) {
          local_3c = 5000;
        }
        else {
          local_3c = (int)((double)iVar1 * 1.5);
        }
        _node1_local->max = iVar1 + local_3c;
        fflush(_stdout);
        if (_node1_local->max * -2 < 0) {
          pRVar3 = (REF_INT *)realloc(_node1_local->e2n,(long)(_node1_local->max << 1) << 2);
          _node1_local->e2n = pRVar3;
        }
        orig = iVar1;
        if (_node1_local->e2n == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x72,"ref_edge_uniq","realloc ref_edge->e2n NULL");
          printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                 (ulong)(uint)(_node1_local->max << 1),(long)(_node1_local->max << 1),4,
                 (long)(_node1_local->max << 1) << 2);
          return 2;
        }
        for (; orig < _node1_local->max; orig = orig + 1) {
          _node1_local->e2n[orig << 1] = -1;
          _node1_local->e2n[orig * 2 + 1] = -1;
        }
      }
      orig = _node1_local->n;
      _node1_local->n = _node1_local->n + 1;
      _node1_local->e2n[orig << 1] = edge;
      _node1_local->e2n[orig * 2 + 1] = ref_private_macro_code_rxs;
      uVar2 = ref_adj_add(_node1_local->adj,_node1_local->e2n[orig << 1],orig);
      if (uVar2 == 0) {
        ref_edge_local._4_4_ = ref_adj_add(_node1_local->adj,_node1_local->e2n[orig * 2 + 1],orig);
        if (ref_edge_local._4_4_ == 0) {
          ref_edge_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",
                 0x83,"ref_edge_uniq",(ulong)ref_edge_local._4_4_,"adj n1");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x80
               ,"ref_edge_uniq",(ulong)uVar2,"adj n0");
        ref_edge_local._4_4_ = uVar2;
      }
    }
    else {
      ref_edge_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_edge.c",0x67,
           "ref_edge_uniq",(ulong)uVar2,"find existing");
    ref_edge_local._4_4_ = uVar2;
  }
  return ref_edge_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_edge_uniq(REF_EDGE ref_edge, REF_INT node0,
                                 REF_INT node1) {
  REF_INT edge;

  /* do nothing if we already have it */
  RXS(ref_edge_with(ref_edge, node0, node1, &edge), REF_NOT_FOUND,
      "find existing");
  if (REF_EMPTY != edge) return REF_SUCCESS;

  /* incremental reallocation */
  if (ref_edge_n(ref_edge) >= ref_edge_max(ref_edge)) {
    REF_INT orig, chunk;
    orig = ref_edge_max(ref_edge);
    /* geometric growth for efficiency */
    chunk = MAX(5000, (REF_INT)(1.5 * (REF_DBL)orig));
    ref_edge_max(ref_edge) = orig + chunk;

    ref_realloc(ref_edge->e2n, 2 * ref_edge_max(ref_edge), REF_INT);
    for (edge = orig; edge < ref_edge_max(ref_edge); edge++) {
      ref_edge_e2n(ref_edge, 0, edge) = REF_EMPTY;
      ref_edge_e2n(ref_edge, 1, edge) = REF_EMPTY;
    }
  }

  edge = ref_edge_n(ref_edge);
  ref_edge_n(ref_edge)++;
  ref_edge_e2n(ref_edge, 0, edge) = node0;
  ref_edge_e2n(ref_edge, 1, edge) = node1;

  RSS(ref_adj_add(ref_edge_adj(ref_edge), ref_edge_e2n(ref_edge, 0, edge),
                  edge),
      "adj n0");
  RSS(ref_adj_add(ref_edge_adj(ref_edge), ref_edge_e2n(ref_edge, 1, edge),
                  edge),
      "adj n1");

  return REF_SUCCESS;
}